

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O0

int parse_commandline(int argc,char **argv,oonf_appdata *appdata,_Bool reload_only)

{
  list_entity *plVar1;
  bool bVar2;
  int iVar3;
  cfg_db *db_00;
  oonf_subsystem *poVar4;
  cfg_db *db_01;
  cfg_instance *pcVar5;
  FILE *local_148;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  int return_code;
  int opt_idx;
  int opt;
  cfg_db *db;
  autobuf log;
  char *parameters;
  oonf_subsystem *plugin;
  _Bool reload_only_local;
  oonf_appdata *appdata_local;
  char **argv_local;
  int argc_local;
  
  __tempptr._4_4_ = 0xffffffff;
  db_00 = oonf_cfg_get_rawdb();
  _optind = 1;
  _opterr = 0xffffffff;
  if ((_ignore_unknown & 1U) != 0) {
    _opterr = 0;
  }
  abuf_init((autobuf *)&db);
  if (reload_only) {
    log._24_8_ = anon_var_dwarf_e605;
  }
  else {
    log._24_8_ = anon_var_dwarf_e61c;
  }
LAB_001191c7:
  do {
    while( true ) {
      while( true ) {
        bVar2 = false;
        if (__tempptr._4_4_ == 0xffffffff) {
          return_code = getopt_long(argc,argv,log._24_8_,oonf_options);
          bVar2 = -1 < return_code;
        }
        if (!bVar2) {
          for (; __tempptr._4_4_ == 0xffffffff && _optind < argc; _optind = _optind + 1) {
            if (_handle_unused_argument != (_func_int_char_ptr *)0x0) {
              (*_handle_unused_argument)(argv[_optind]);
            }
          }
          if (log._total != 0) {
            if (reload_only) {
              if ((log_global_mask[1] & 4) != 0) {
                oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",0x26b,(void *)0x0,0,
                         "Cannot reload configuration.\n%s",log._len);
              }
            }
            else {
              if (__tempptr._4_4_ == 0) {
                local_148 = _stdout;
              }
              else {
                local_148 = _stderr;
              }
              fputs((char *)log._len,local_148);
            }
          }
          abuf_free((autobuf *)&db);
          return __tempptr._4_4_;
        }
        if (return_code != 1) break;
        if (_handle_unused_argument != (_func_int_char_ptr *)0x0) {
          (*_handle_unused_argument)(_optarg);
        }
      }
      if (return_code != 0x3f) break;
LAB_00119675:
      if ((!reload_only) && ((_ignore_unknown & 1U) == 0)) {
        abuf_appendf((autobuf *)&db,"Unknown parameter: \'%c\' (%d)\n",(ulong)(uint)return_code,
                     (ulong)(uint)return_code);
        __tempptr._4_4_ = 1;
      }
    }
    if (return_code == 0x53) {
      pcVar5 = oonf_cfg_get_instance();
      iVar3 = cfg_cmd_handle_save(pcVar5,db_00,_optarg,(autobuf *)&db);
      if (iVar3 != 0) {
        __tempptr._4_4_ = 1;
      }
      goto LAB_001191c7;
    }
    if (return_code == 0x67) {
      pcVar5 = oonf_cfg_get_instance();
      iVar3 = cfg_cmd_handle_get(pcVar5,db_00,_optarg,(autobuf *)&db);
      __tempptr._4_4_ = (uint)(iVar3 != 0);
    }
    else if (return_code == 0x68) {
      abuf_appendf((autobuf *)&db,"Usage: %s [OPTION]...\n%s%s%s",*argv,appdata->help_prefix,
                   help_text,appdata->help_suffix);
      __tempptr._4_4_ = 0;
    }
    else if (return_code == 0x6c) {
      pcVar5 = oonf_cfg_get_instance();
      iVar3 = cfg_cmd_handle_load(pcVar5,db_00,_optarg,(autobuf *)&db);
      if (iVar3 != 0) {
        __tempptr._4_4_ = 1;
      }
    }
    else if (return_code == 0x70) {
      poVar4 = oonf_cfg_load_subsystem(_optarg);
      if (poVar4 == (oonf_subsystem *)0x0) {
        __tempptr._4_4_ = 1;
      }
      else {
        db_01 = oonf_cfg_get_rawdb();
        cfg_db_set_entry_ext(db_01,"global",(char *)0x0,"plugin",_optarg,true,true);
      }
    }
    else if (return_code == 0x71) {
      oonf_cfg_exit();
    }
    else if (return_code == 0x72) {
      pcVar5 = oonf_cfg_get_instance();
      iVar3 = cfg_cmd_handle_remove(pcVar5,db_00,_optarg,(autobuf *)&db);
      if (iVar3 != 0) {
        __tempptr._4_4_ = 1;
      }
    }
    else if (return_code == 0x73) {
      pcVar5 = oonf_cfg_get_instance();
      iVar3 = cfg_cmd_handle_set(pcVar5,db_00,_optarg,(autobuf *)&db);
      if (iVar3 != 0) {
        __tempptr._4_4_ = 1;
      }
    }
    else if (return_code == 0x76) {
      oonf_log_printversion((autobuf *)&db);
      for (plVar1 = oonf_plugin_tree.list_head.next; parameters = (char *)(plVar1 + -7),
          plVar1->prev != oonf_plugin_tree.list_head.prev; plVar1 = plVar1->next) {
        if (plVar1[-1].next == (list_entity *)0x0) {
          abuf_appendf((autobuf *)&db,"Static plugin: %s\n",*(undefined8 *)parameters);
        }
      }
      __tempptr._4_4_ = 0;
    }
    else if (return_code == 0x100) {
      _schema_name = _optarg;
      _display_schema = true;
    }
    else if (1 < return_code - 0x101U) goto LAB_00119675;
  } while( true );
}

Assistant:

static int
parse_commandline(int argc, char **argv, const struct oonf_appdata *appdata __attribute((unused)), bool reload_only) {
  struct oonf_subsystem *plugin;
  const char *parameters;
  struct autobuf log;
  struct cfg_db *db;
  int opt, opt_idx, return_code;

  return_code = -1;
  db = oonf_cfg_get_rawdb();

  /* reset getopt_long */
  opt_idx = -1;
  optind = 1;
  opterr = _ignore_unknown ? 0 : -1;

  abuf_init(&log);

  if (reload_only) {
    /* only parameters that load and change configuration data */
    parameters = "-p:l:s:r:f:n";
  }
  else {
    parameters = "-hvp:ql:S:s:r:g::f:n";
  }

  while (return_code == -1 && 0 <= (opt = getopt_long(argc, argv, parameters, oonf_options, &opt_idx))) {
    switch (opt) {
      case 'h':
#if !defined(REMOVE_HELPTEXT)
        abuf_appendf(
          &log, "Usage: %s [OPTION]...\n%s%s%s", argv[0], appdata->help_prefix, help_text, appdata->help_suffix);
#endif
        return_code = 0;
        break;

      case argv_option_debug_early:
      case argv_option_ignore_unknown:
        /* ignore this here */
        break;

      case 'v':
        oonf_log_printversion(&log);
        avl_for_each_element(&oonf_plugin_tree, plugin, _node) {
          if (!oonf_subsystem_is_dynamic(plugin)) {
            abuf_appendf(&log, "Static plugin: %s\n", plugin->name);
          }
        }
        return_code = 0;
        break;
      case 'p':
        if (oonf_cfg_load_subsystem(optarg) == NULL) {
          return_code = 1;
        }
        else {
          cfg_db_add_entry(oonf_cfg_get_rawdb(), CFG_SECTION_GLOBAL, NULL, CFG_GLOBAL_PLUGIN, optarg);
        }
        break;
      case 'q':
        oonf_cfg_exit();
        break;

      case argv_option_schema:
        _schema_name = optarg;
        _display_schema = true;
        break;

      case 'l':
        if (cfg_cmd_handle_load(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'S':
        if (cfg_cmd_handle_save(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 's':
        if (cfg_cmd_handle_set(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'r':
        if (cfg_cmd_handle_remove(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'g':
        if (cfg_cmd_handle_get(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        else {
          return_code = 0;
        }
        break;
      case 1:
        /* string that is not part of an option */
        if (_handle_unused_argument) {
          _handle_unused_argument(optarg);
        }
        break;

      case '?':
      default:
        if (!(reload_only || _ignore_unknown)) {
          abuf_appendf(&log, "Unknown parameter: '%c' (%d)\n", opt, opt);
          return_code = 1;
        }
        break;
    }
  }

  while (return_code == -1 && optind < argc) {
    /* handle the end of the command line */
    if (_handle_unused_argument) {
      _handle_unused_argument(argv[optind]);
    }
    optind++;
  }

  if (abuf_getlen(&log) > 0) {
    if (reload_only) {
      OONF_WARN(LOG_MAIN, "Cannot reload configuration.\n%s", abuf_getptr(&log));
    }
    else {
      fputs(abuf_getptr(&log), return_code == 0 ? stdout : stderr);
    }
  }

  abuf_free(&log);

  return return_code;
}